

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::CheckCompress(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                *this)

{
  int iVar1;
  int64_t iVar2;
  long in_RDI;
  double nfreerate;
  TPZFrontSym<std::complex<float>_> *in_stack_00000130;
  
  iVar2 = TPZFrontSym<std::complex<float>_>::NFree((TPZFrontSym<std::complex<float>_> *)0x1cedf4f);
  iVar1 = TPZFront<std::complex<float>_>::FrontSize
                    ((TPZFront<std::complex<float>_> *)(in_RDI + 0xd8));
  if (20.0 < ((double)iVar2 / (double)iVar1) * 100.0) {
    TPZFrontSym<std::complex<float>_>::Compress(in_stack_00000130);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::CheckCompress()
{
	double nfreerate = ( (double)fFront.NFree() / (double)fFront.FrontSize() ) * 100;
	if(nfreerate>20.) 
	{
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Compressing front nfreerate " << nfreerate << " NFree " << fFront.NFree() << " Front elements " << fFront.FrontSize();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		fFront.Compress();
#ifdef PZ_LOG
        if (loggerfw.isInfoEnabled())
		{
			std::stringstream sout;
			sout << "Frondwidth after Compress "<< fFront.FrontSize();
			LOGPZ_INFO(loggerfw,sout.str())
		}
#endif
	}
}